

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O1

void __thiscall xe::ContainerFormatParser::parseContainerLine(ContainerFormatParser *this)

{
  char cVar1;
  ContainerElement CVar2;
  int iVar3;
  uint uVar4;
  undefined8 extraout_RAX;
  byte bVar5;
  byte bVar6;
  ContainerFormatParser *pCVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  int local_64;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_64 = 1;
  lVar8 = 0;
  do {
    local_40._8_8_ = parseContainerLine::s_elements + lVar8;
    iVar3 = 0;
    bVar6 = 0;
    do {
      iVar9 = iVar3 + 1;
      uVar4 = 0;
      if ((iVar9 < this->m_elementLen) && (uVar4 = 0xffffffff, iVar9 < (this->m_buf).m_numElements))
      {
        uVar4 = (uint)(this->m_buf).m_buffer[((this->m_buf).m_back + iVar9) % (this->m_buf).m_size];
      }
      cVar1 = parseContainerLine::s_elements[lVar8].name[iVar3];
      bVar5 = (byte)(0x200004803 >> ((byte)(uVar4 + 1) & 0x3f)) & uVar4 + 1 < 0x22;
      if ((bVar5 == 0) && (cVar1 != '\0')) {
        bVar10 = uVar4 == (int)cVar1;
        if (!bVar10) {
          iVar9 = iVar3;
        }
      }
      else {
        bVar6 = bVar5 ^ cVar1 == '\0' ^ 1;
        bVar10 = false;
        iVar9 = iVar3;
      }
      iVar3 = iVar9;
    } while (bVar10);
    if (bVar6 != 0) {
      this->m_element = parseContainerLine::s_elements[lVar8].element;
      local_64 = iVar3 + 1;
      break;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  CVar2 = this->m_element;
  if (CVar2 < CONTAINERELEMENT_TEST_LOG_DATA) {
    if ((0x4cU >> (CVar2 & 0x1f) & 1) != 0) {
      return;
    }
    local_40._M_allocated_capacity = (size_type)this;
    if ((0xa0U >> (CVar2 & 0x1f) & 1) == 0) {
      if (CVar2 != CONTAINERELEMENT_SESSION_INFO) goto LAB_00114a20;
      if (((this->m_buf).m_numElements <= local_64) ||
         ((this->m_buf).m_buffer[((this->m_buf).m_back + local_64) % (this->m_buf).m_size] != ' '))
      goto LAB_00114acc;
      local_64 = local_64 + 1;
      parseContainerValue(this,&this->m_attribute,&local_64);
      if (((this->m_buf).m_numElements <= local_64) ||
         ((this->m_buf).m_buffer[((this->m_buf).m_back + local_64) % (this->m_buf).m_size] != ' '))
      goto LAB_00114af7;
      local_64 = local_64 + 1;
      iVar3 = std::__cxx11::string::compare((char *)&this->m_attribute);
      if (iVar3 == 0) {
        (this->m_value)._M_string_length = 0;
        *(this->m_value)._M_dataplus._M_p = '\0';
        iVar3 = local_64;
        while( true ) {
          uVar4 = 0;
          if ((iVar3 < this->m_elementLen) &&
             (uVar4 = 0xffffffff, iVar3 < (this->m_buf).m_numElements)) {
            uVar4 = (uint)(this->m_buf).m_buffer
                          [((this->m_buf).m_back + iVar3) % (this->m_buf).m_size];
          }
          if ((uVar4 + 1 < 0xc) && ((0xc03U >> (uVar4 + 1 & 0x1f) & 1) != 0)) break;
          std::__cxx11::string::push_back((char)this + '0');
          iVar3 = iVar3 + 1;
        }
        return;
      }
    }
    else {
      if (((this->m_buf).m_numElements <= local_64) ||
         ((this->m_buf).m_buffer[((this->m_buf).m_back + local_64) % (this->m_buf).m_size] != ' '))
      {
        local_60._0_8_ = local_60 + 0x10;
        pCVar7 = (ContainerFormatParser *)local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pCVar7,"Expected value after instruction","");
        error(pCVar7,(string *)local_60);
LAB_00114acc:
        local_60._0_8_ = local_60 + 0x10;
        pCVar7 = (ContainerFormatParser *)local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pCVar7,"Expected attribute name after #sessionInfo","");
        error(pCVar7,(string *)local_60);
LAB_00114af7:
        pCVar7 = (ContainerFormatParser *)local_60;
        local_60._0_8_ = local_60 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pCVar7,"No value for #sessionInfo attribute","");
        error(pCVar7,(string *)local_60);
        if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
          operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
        }
        _Unwind_Resume(extraout_RAX);
      }
      local_64 = local_64 + 1;
    }
    parseContainerValue(this,&this->m_value,&local_64);
  }
  else {
LAB_00114a20:
    this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
  }
  return;
}

Assistant:

void ContainerFormatParser::parseContainerLine (void)
{
	static const struct
	{
		const char*			name;
		ContainerElement	element;
	} s_elements[] =
	{
		{ "beginTestCaseResult",		CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT		},
		{ "endTestCaseResult",			CONTAINERELEMENT_END_TEST_CASE_RESULT		},
		{ "terminateTestCaseResult",	CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT	},
		{ "sessionInfo",				CONTAINERELEMENT_SESSION_INFO				},
		{ "beginSession",				CONTAINERELEMENT_BEGIN_SESSION				},
		{ "endSession",					CONTAINERELEMENT_END_SESSION				}
	};

	DE_ASSERT(m_elementLen >= 1);
	DE_ASSERT(getChar(0) == '#');

	int offset = 1;

	for (int elemNdx = 0; elemNdx < DE_LENGTH_OF_ARRAY(s_elements); elemNdx++)
	{
		bool	isMatch	= false;
		int		ndx		= 0;

		for (;;)
		{
			int		bufChar		= (offset+ndx < m_elementLen) ? getChar(offset+ndx) : 0;
			bool	bufEnd		= bufChar == 0 || bufChar == ' ' || bufChar == '\r' || bufChar == '\n' || bufChar == (int)END_OF_BUFFER;
			int		elemChar	= s_elements[elemNdx].name[ndx];
			bool	elemEnd		= elemChar == 0;

			if (bufEnd || elemEnd)
			{
				isMatch = bufEnd == elemEnd;
				break;
			}
			else if (bufChar != elemChar)
				break;

			ndx += 1;
		}

		if (isMatch)
		{
			m_element	 = s_elements[elemNdx].element;
			offset		+= ndx;
			break;
		}
	}

	switch (m_element)
	{
		case CONTAINERELEMENT_BEGIN_SESSION:
		case CONTAINERELEMENT_END_SESSION:
		case CONTAINERELEMENT_END_TEST_CASE_RESULT:
			break; // No attribute or value.

		case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
		case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
			if (getChar(offset) != ' ')
				error("Expected value after instruction");
			offset += 1;
			parseContainerValue(m_value, offset);
			break;

		case CONTAINERELEMENT_SESSION_INFO:
			if (getChar(offset) != ' ')
				error("Expected attribute name after #sessionInfo");
			offset += 1;
			parseContainerValue(m_attribute, offset);
			if (getChar(offset) != ' ')
				error("No value for #sessionInfo attribute");
			offset += 1;

			if (m_attribute == "timestamp")
			{
				m_value.clear();

				// \note Candy produces unescaped timestamps.
				for (;;)
				{
					const int	curChar	= offset < m_elementLen ? getChar(offset) : 0;
					const bool	isEnd	= curChar == 0 || curChar == (int)END_OF_BUFFER || curChar == '\n' || curChar == '\t';

					if (isEnd)
						break;
					else
						m_value.push_back((char)curChar);

					offset += 1;
				}
			}
			else
				parseContainerValue(m_value, offset);
			break;

		default:
			// \todo [2012-06-09 pyry] Implement better way to handle # at the beginning of log lines.
			m_element = CONTAINERELEMENT_TEST_LOG_DATA;
			break;
	}
}